

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c++
# Opt level: O2

EncodingResult<kj::Array<char32_t>_> * __thiscall
kj::encodeUtf32(EncodingResult<kj::Array<char32_t>_> *__return_storage_ptr__,kj *this,
               ArrayPtr<const_char> text,bool nulTerminate)

{
  char *pcVar1;
  EncodingResult<kj::Array<char32_t>_> *pEVar2;
  char *pcVar3;
  bool bVar4;
  char *pcVar5;
  ulong uVar6;
  char *pcVar7;
  byte c;
  char16_t u;
  Vector<char32_t> result;
  kj local_7d;
  uint local_7c;
  Array<char32_t> local_78;
  ArrayBuilder<char32_t> local_58;
  EncodingResult<kj::Array<char32_t>_> *local_38;
  
  pcVar3 = text.ptr;
  local_7c = (uint)text.size_;
  uVar6 = (ulong)local_7c;
  local_38 = __return_storage_ptr__;
  local_58.ptr = _::HeapArrayDisposer::allocateUninitialized<char32_t>((size_t)(pcVar3 + uVar6));
  local_58.endPtr = local_58.ptr + (long)(pcVar3 + uVar6);
  local_58.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  bVar4 = false;
  pcVar5 = (char *)0x0;
  local_58.pos = local_58.ptr;
  while( true ) {
    if (pcVar3 <= pcVar5) break;
    pcVar1 = pcVar5 + 1;
    local_7d = this[(long)pcVar5];
    if ((char)local_7d < '\0') {
      pcVar7 = pcVar1;
      if (0xbf < (byte)local_7d) {
        if ((byte)local_7d < 0xe0) {
          pcVar7 = pcVar3;
          if (pcVar1 != pcVar3) {
            pcVar7 = pcVar1;
          }
        }
        else if (((byte)local_7d < 0xf0) && (pcVar7 = pcVar3, pcVar1 != pcVar3)) {
          pcVar7 = pcVar1;
        }
      }
      local_78.ptr = (char32_t *)CONCAT44(local_78.ptr._4_4_,0xfffd);
      Vector<char32_t>::add<int>((Vector<char32_t> *)&local_58,(int *)&local_78);
      pcVar5 = pcVar3;
      if (pcVar3 < pcVar7) {
        pcVar5 = pcVar7;
      }
      bVar4 = true;
      if (pcVar7 < pcVar3) {
        pcVar5 = pcVar7;
      }
    }
    else {
      Vector<char32_t>::add<unsigned_char&>((Vector<char32_t> *)&local_58,(uchar *)&local_7d);
      pcVar5 = pcVar1;
    }
  }
  if ((char)local_7c != '\0') {
    local_78.ptr = (char32_t *)((ulong)local_78.ptr._4_4_ << 0x20);
    Vector<char32_t>::add<int>((Vector<char32_t> *)&local_58,(int *)&local_78);
  }
  Vector<char32_t>::releaseAsArray(&local_78,(Vector<char32_t> *)&local_58);
  pEVar2 = local_38;
  (local_38->super_Array<char32_t>).ptr = local_78.ptr;
  (local_38->super_Array<char32_t>).size_ = local_78.size_;
  (local_38->super_Array<char32_t>).disposer = local_78.disposer;
  local_78.ptr = (char32_t *)0x0;
  local_78.size_ = 0;
  local_38->hadErrors = bVar4;
  Array<char32_t>::~Array(&local_78);
  ArrayBuilder<char32_t>::dispose(&local_58);
  return pEVar2;
}

Assistant:

EncodingResult<Array<char32_t>> encodeUtf32(ArrayPtr<const char> text, bool nulTerminate) {
  return encodeUtf<char32_t>(text, nulTerminate);
}